

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ConfigDeclarationSyntax::setChild
          (ConfigDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *pSVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *pSVar9;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *pSVar11;
  NamedBlockClauseSyntax *pNVar12;
  logic_error *this_00;
  long *plVar13;
  size_type *psVar14;
  long *plVar15;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (10 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar13 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar13;
    psVar14 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar14) {
      local_b0.field_2._M_allocated_capacity = *psVar14;
      local_b0.field_2._8_8_ = plVar13[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar14;
    }
    local_b0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::to_string(&local_70,0xb51);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar13;
    plVar15 = plVar13 + 2;
    if (local_90 == plVar15) {
      local_80 = *plVar15;
      lStack_78 = plVar13[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar15;
    }
    local_88 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar13;
    plVar15 = plVar13 + 2;
    if (local_f0 == plVar15) {
      local_e0 = *plVar15;
      lStack_d8 = plVar13[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar15;
    }
    local_e8 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar10);
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 1:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->config).kind = pvVar8->kind;
    (this->config).field_0x2 = uVar3;
    (this->config).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->config).rawLen = uVar5;
    (this->config).info = pIVar2;
    break;
  case 2:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->name).kind = pvVar8->kind;
    (this->name).field_0x2 = uVar3;
    (this->name).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->name).rawLen = uVar5;
    (this->name).info = pIVar2;
    break;
  case 3:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->semi1).kind = pvVar8->kind;
    (this->semi1).field_0x2 = uVar3;
    (this->semi1).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->semi1).rawLen = uVar5;
    (this->semi1).info = pIVar2;
    break;
  case 4:
    ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    pSVar7 = SyntaxNode::
             as<slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>>
                       (*ppSVar10);
    (this->localparams).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->localparams).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->localparams).super_SyntaxListBase.childCount = (pSVar7->super_SyntaxListBase).childCount;
    sVar1 = (pSVar7->
            super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
            ).size_;
    (this->localparams).
    super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar7->
         super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>).
         data_;
    (this->localparams).
    super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.size_ =
         sVar1;
    break;
  case 5:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->design).kind = pvVar8->kind;
    (this->design).field_0x2 = uVar3;
    (this->design).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->design).rawLen = uVar5;
    (this->design).info = pIVar2;
    break;
  case 6:
    ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    pSVar9 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>>
                       (*ppSVar10);
    (this->topCells).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar9->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->topCells).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar9->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->topCells).super_SyntaxListBase.childCount = (pSVar9->super_SyntaxListBase).childCount;
    sVar1 = (pSVar9->super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>
            ).size_;
    (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>
    .data_ = (pSVar9->
             super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>).data_;
    (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>
    .size_ = sVar1;
    break;
  case 7:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->semi2).kind = pvVar8->kind;
    (this->semi2).field_0x2 = uVar3;
    (this->semi2).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->semi2).rawLen = uVar5;
    (this->semi2).info = pIVar2;
    break;
  case 8:
    ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    pSVar11 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>>(*ppSVar10);
    (this->rules).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar11->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->rules).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar11->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->rules).super_SyntaxListBase.childCount = (pSVar11->super_SyntaxListBase).childCount;
    sVar1 = (pSVar11->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>).size_;
    (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar11->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>).data_;
    (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.size_ =
         sVar1;
    break;
  case 9:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->endconfig).kind = pvVar8->kind;
    (this->endconfig).field_0x2 = uVar3;
    (this->endconfig).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->endconfig).rawLen = uVar5;
    (this->endconfig).info = pIVar2;
    break;
  case 10:
    ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    if (*ppSVar10 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar12 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            &child);
      pNVar12 = (NamedBlockClauseSyntax *)*ppSVar10;
      if ((pNVar12->super_SyntaxNode).kind != NamedBlockClause) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedBlockClauseSyntax]")
        ;
      }
    }
    this->blockName = pNVar12;
  }
  return;
}

Assistant:

void ConfigDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: config = child.token(); return;
        case 2: name = child.token(); return;
        case 3: semi1 = child.token(); return;
        case 4: localparams = child.node()->as<SyntaxList<ParameterDeclarationStatementSyntax>>(); return;
        case 5: design = child.token(); return;
        case 6: topCells = child.node()->as<SyntaxList<ConfigCellIdentifierSyntax>>(); return;
        case 7: semi2 = child.token(); return;
        case 8: rules = child.node()->as<SyntaxList<ConfigRuleSyntax>>(); return;
        case 9: endconfig = child.token(); return;
        case 10: blockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}